

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O1

void __thiscall
Enhedron::Test::Impl::Impl_Results::HumanResults::failByException
          (HumanResults *this,NameStack *context,string *given,NameStack *whenStack,exception *e)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  
  lVar3 = this->whenDepth_ + (ulong)(this->whenDepth_ == 0);
  do {
    ::std::__ostream_insert<char,std::char_traits<char>>((this->output_).value,"    ",4);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  poVar1 = (this->output_).value;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TEST FAILED WITH EXCEPTION: ",0x1c);
  __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
  if (__s == (char *)0x0) {
    ::std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  ::std::ostream::put((char)poVar1);
  ::std::ostream::flush();
  return;
}

Assistant:

virtual void failByException(const NameStack& context,
                                     const string& given,
                                     const NameStack& whenStack,
                                     const exception& e) override {
            indent(whenDepth());
            (*output_) << "TEST FAILED WITH EXCEPTION: " << e.what() << endl;
        }